

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_http_server.c
# Opt level: O0

void split_request(char *request)

{
  size_t __n;
  ptrdiff_t bytes_to_copy;
  char *to;
  char *from;
  char *request_local;
  
  num_of_request_lines = 0;
  bytes_to_copy = (ptrdiff_t)strchr(request,10);
  to = request;
  while (bytes_to_copy != 0) {
    __n = (bytes_to_copy - (long)to) + 1;
    memcpy(line_buffer + num_of_request_lines,to,__n);
    *(undefined1 *)((long)line_buffer + __n + num_of_request_lines * 100) = 0;
    num_of_request_lines = num_of_request_lines + 1;
    to = (char *)(bytes_to_copy + 1);
    bytes_to_copy = (ptrdiff_t)strchr(to,10);
  }
  return;
}

Assistant:

static void split_request(const char *request)
{
	num_of_request_lines = 0;
	const char *from = request;
	const char *to = strchr(request, '\n');
	while (to != NULL) {
		ptrdiff_t bytes_to_copy = to - from + 1;
		memcpy(line_buffer[num_of_request_lines], from, (size_t)bytes_to_copy);
		line_buffer[num_of_request_lines][bytes_to_copy] = '\0';
		num_of_request_lines++;
		to++;
		from = to;
		to = strchr(to, '\n');
	}
}